

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_common.cpp
# Opt level: O2

client_pipe __thiscall pstore::brokerface::fifo_path::open_client_pipe(fifo_path *this)

{
  ostream *__os;
  fifo_path *in_RSI;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream str;
  
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock = -1;
  for (uVar1 = 0; in_RSI->max_retries_ == 0xffffffff || uVar1 <= in_RSI->max_retries_;
      uVar1 = uVar1 + 1) {
    std::function<void_(pstore::brokerface::fifo_path::operation)>::operator()
              (&in_RSI->update_cb_,open);
    open_impl((fifo_path *)&str);
    details::descriptor<pstore::details::posix_descriptor_traits>::operator=
              ((descriptor<pstore::details::posix_descriptor_traits> *)this,
               (descriptor<pstore::details::posix_descriptor_traits> *)&str);
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor
              ((descriptor<pstore::details::posix_descriptor_traits> *)&str);
    if (-1 < (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock) {
      return (client_pipe)this;
    }
    std::function<void_(pstore::brokerface::fifo_path::operation)>::operator()
              (&in_RSI->update_cb_,wait);
    wait_until_impl(in_RSI,(milliseconds)(in_RSI->retry_timeout_).__r);
  }
  if (-1 < (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock) {
    return (client_pipe)this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  __os = std::operator<<((ostream *)&str,"Could not open client named pipe ");
  local_1c8._M_dataplus._M_p = (pointer)&in_RSI->path_;
  local_1c8._M_string_length._0_2_ = 0x22;
  std::__detail::operator<<
            (__os,(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                   *)&local_1c8);
  std::__cxx11::stringbuf::str();
  raise<pstore::error_code,std::__cxx11::string>(unable_to_open_named_pipe,&local_1c8);
}

Assistant:

auto fifo_path::open_client_pipe () const -> client_pipe {
            client_pipe fd{};
            auto tries = 0U;
            for (; max_retries_ == infinite_retries || tries <= max_retries_; ++tries) {
                update_cb_ (operation::open);
                fd = this->open_impl ();
                if (fd.valid ()) {
                    break;
                }
                update_cb_ (operation::wait);
                this->wait_until_impl (retry_timeout_);
            }

            if (!fd.valid ()) {
                std::ostringstream str;
                str << "Could not open client named pipe " << pstore::quoted (path_);
                raise (error_code::unable_to_open_named_pipe, str.str ());
            }
            return fd;
        }